

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PostfixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange range;
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  Expression *pEVar2;
  SourceLocation SVar3;
  SourceLocation in_RDX;
  SyntaxKind *in_RSI;
  Diagnostic *in_RDI;
  ASTContext *unaff_retaddr;
  Expression *in_stack_00000008;
  bitmask<slang::ast::AssignFlags> in_stack_00000017;
  SourceLocation in_stack_00000018;
  Type *in_stack_00000058;
  ASTContext *in_stack_00000060;
  ExpressionSyntax *in_stack_00000068;
  Compilation *in_stack_00000070;
  bitmask<slang::ast::ASTFlags> in_stack_00000078;
  Diagnostic *diag;
  Expression *result;
  Type *type;
  Expression *operand;
  Expression *in_stack_fffffffffffffe98;
  Compilation *in_stack_fffffffffffffea0;
  SourceLocation in_stack_fffffffffffffea8;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffeb0;
  SourceLocation in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  SourceLocation in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  DiagCode in_stack_fffffffffffffed4;
  Expression *in_stack_fffffffffffffed8;
  Type *in_stack_fffffffffffffee0;
  UnaryOperator *in_stack_fffffffffffffee8;
  SourceLocation arg;
  SourceLocation this;
  Diagnostic *pDVar4;
  __extent_storage<18446744073709551615UL> _Var5;
  bitmask<slang::ast::ASTFlags> local_90;
  bitmask<slang::ast::ASTFlags> local_88;
  bitmask<slang::ast::ASTFlags> local_80;
  bitmask<slang::ast::AssignFlags> local_71;
  SourceLocation local_70;
  SourceRange local_68;
  SourceRange local_58;
  UnaryOperator local_44;
  UnaryExpression *local_40;
  Type *local_38;
  underlying_type local_30;
  Expression *local_28;
  SourceLocation local_20;
  SyntaxKind *local_18;
  Diagnostic *local_10;
  Expression *in_stack_fffffffffffffff8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pEVar2 = (Expression *)
           not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa37cfd);
  this = local_20;
  local_30 = (underlying_type)
             ast::operator|((ASTFlags)in_stack_fffffffffffffea8,(ASTFlags)in_stack_fffffffffffffea0)
  ;
  local_28 = Expression::create(in_stack_00000070,in_stack_00000068,in_stack_00000060,
                                in_stack_00000078,in_stack_00000058);
  local_38 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xa37d65);
  local_44 = OpInfo::getUnary(*local_18);
  _Var5._M_extent_value = (size_t)local_28;
  local_58 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_RDI);
  local_68 = parsing::Token::range
                       ((Token *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_40 = BumpAllocator::
             emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange,slang::SourceRange>
                       ((BumpAllocator *)in_RDI,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8,
                        (SourceRange *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                        ,(SourceRange *)in_stack_fffffffffffffec8);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffea0);
  if (bVar1) {
LAB_00a37eb5:
    pEVar2 = Expression::badExpr(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    return pEVar2;
  }
  arg = local_20;
  local_70 = parsing::Token::location((Token *)(local_18 + 0x16));
  memset(&local_71,0,1);
  bitmask<slang::ast::AssignFlags>::bitmask(&local_71);
  bVar1 = Expression::requireLValue
                    (in_stack_00000008,unaff_retaddr,in_stack_00000018,in_stack_00000017,
                     in_stack_fffffffffffffff8);
  if (!bVar1) goto LAB_00a37eb5;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_80,NonProcedural);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffeb0,
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffea8);
  pDVar4 = local_10;
  if (bVar1) {
    in_stack_fffffffffffffec8 = (SourceLocation)((long)local_20 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_88,AssignmentAllowed);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffeb0,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffea8);
    SVar3._4_4_ = in_stack_fffffffffffffec4;
    SVar3._0_4_ = in_stack_fffffffffffffec0;
    in_stack_fffffffffffffed4.code._1_1_ = 1;
    pDVar4 = local_10;
    if (!bVar1) goto LAB_00a37f8f;
  }
  SVar3 = (SourceLocation)((long)local_20 + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_90,AssignmentDisallowed);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffeb0,
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffea8);
  in_stack_fffffffffffffed4.code._1_1_ = bVar1;
LAB_00a37f8f:
  if (in_stack_fffffffffffffed4.code._1_1_ != '\0') {
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_RDI);
    sourceRange.endLoc = in_stack_fffffffffffffec8;
    sourceRange.startLoc = SVar3;
    ASTContext::addDiag((ASTContext *)local_20,in_stack_fffffffffffffed4,sourceRange);
    pEVar2 = Expression::badExpr(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    return pEVar2;
  }
  bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffea0);
  if (!bVar1) {
    parsing::Token::location((Token *)(local_18 + 0x16));
    ASTContext::addDiag((ASTContext *)local_20,SVar3._4_4_,in_stack_fffffffffffffeb8);
    ast::operator<<(in_RDI,(Type *)arg);
    range.endLoc = local_20;
    range.startLoc = in_stack_fffffffffffffea8;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffea0,range);
    pEVar2 = Expression::badExpr(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    return pEVar2;
  }
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            (in_stack_fffffffffffffeb0,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_40);
  syntax_00._M_extent._M_extent_value = _Var5._M_extent_value;
  syntax_00._M_ptr = (pointer)pDVar4;
  ASTContext::setAttributes((ASTContext *)this,pEVar2,syntax_00);
  return &local_40->super_Expression;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PostfixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    // This method is only ever called for postincrement and postdecrement operators, so
    // the operand must be an lvalue.
    Expression& operand = create(compilation, *syntax.operand, context,
                                 ASTFlags::LValue | ASTFlags::LAndRValue);
    const Type* type = operand.type;

    Expression* result = compilation.emplace<UnaryExpression>(OpInfo::getUnary(syntax.kind), *type,
                                                              operand, syntax.sourceRange(),
                                                              syntax.operatorToken.range());
    if (operand.bad() || !operand.requireLValue(context, syntax.operatorToken.location()))
        return badExpr(compilation, result);

    if ((context.flags.has(ASTFlags::NonProcedural) &&
         !context.flags.has(ASTFlags::AssignmentAllowed)) ||
        context.flags.has(ASTFlags::AssignmentDisallowed)) {
        context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
        return badExpr(compilation, result);
    }

    if (!type->isNumeric()) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}